

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall ChatClient::incomingData(ChatClient *this,Stream *stream)

{
  Stream *stream_00;
  uint __line;
  char *__assertion;
  string line;
  
  stream_00 = this->inputStream;
  if (stream_00 == (Stream *)0x0) {
    __assertion = "inputStream";
    __line = 0x62;
  }
  else {
    if (this->remoteStream != (Stream *)0x0) {
      if (stream_00 == stream) {
        readLine_abi_cxx11_(&line,stream_00);
        sendString(this->remoteStream,&line);
      }
      else {
        readLine_abi_cxx11_(&line,this->remoteStream);
        std::operator<<((ostream *)&std::cout,(string *)&line);
        std::ostream::flush();
      }
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    __assertion = "remoteStream";
    __line = 99;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/chat.cpp"
                ,__line,"virtual void ChatClient::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		assert(inputStream);
		assert(remoteStream);

		if (stream == inputStream)
		{
			string line = readLine(inputStream);
			sendString(remoteStream, line);
		}
		else
		{
			string line = readLine(remoteStream);
			cout << line;
			cout.flush();
		}
	}